

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_settop(lua_State *L,int idx)

{
  long lVar1;
  long local_38;
  ptrdiff_t diff;
  StkId newtop;
  StkId func;
  CallInfo *ci;
  int idx_local;
  lua_State *L_local;
  
  if (idx < 0) {
    local_38 = (long)(idx + 1);
  }
  else {
    for (local_38 = ((L->ci->func).offset + 0x10 + (long)idx * 0x10) - (L->top).offset >> 4;
        0 < local_38; local_38 = local_38 + -1) {
      lVar1 = (L->top).offset;
      (L->top).p = (StkId)(lVar1 + 0x10);
      *(undefined1 *)(lVar1 + 8) = 0;
    }
  }
  diff = (ptrdiff_t)((L->top).p + local_38);
  if ((local_38 < 0) && ((ulong)diff <= (L->tbclist).p)) {
    diff = (ptrdiff_t)luaF_close(L,(StkId)diff,-1,0);
  }
  (L->top).offset = diff;
  return;
}

Assistant:

LUA_API void lua_settop (lua_State *L, int idx) {
  CallInfo *ci;
  StkId func, newtop;
  ptrdiff_t diff;  /* difference for new top */
  lua_lock(L);
  ci = L->ci;
  func = ci->func.p;
  if (idx >= 0) {
    api_check(L, idx <= ci->top.p - (func + 1), "new top too large");
    diff = ((func + 1) + idx) - L->top.p;
    for (; diff > 0; diff--)
      setnilvalue(s2v(L->top.p++));  /* clear new slots */
  }
  else {
    api_check(L, -(idx+1) <= (L->top.p - (func + 1)), "invalid new top");
    diff = idx + 1;  /* will "subtract" index (as it is negative) */
  }
  api_check(L, L->tbclist.p < L->top.p, "previous pop of an unclosed slot");
  newtop = L->top.p + diff;
  if (diff < 0 && L->tbclist.p >= newtop) {
    lua_assert(hastocloseCfunc(ci->nresults));
    newtop = luaF_close(L, newtop, CLOSEKTOP, 0);
  }
  L->top.p = newtop;  /* correct top only after closing any upvalue */
  lua_unlock(L);
}